

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cfg_analysis.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::StructuredCFGAnalysis::MergeBlock(StructuredCFGAnalysis *this,uint32_t bb_id)

{
  IRContext *this_00;
  uint32_t uVar1;
  iterator iVar2;
  BasicBlock *this_01;
  Instruction *this_02;
  key_type_conflict local_14;
  
  iVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->bb_to_construct_)._M_h,&local_14);
  if ((iVar2.
       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>,_false>
       ._M_cur == (__node_type *)0x0) ||
     (uVar1 = *(uint32_t *)
               ((long)iVar2.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::StructuredCFGAnalysis::ConstructInfo>,_false>
                      ._M_cur + 0xc), uVar1 == 0)) {
    uVar1 = 0;
  }
  else {
    this_00 = this->context_;
    if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(this_00);
    }
    this_01 = CFG::block((this_00->cfg_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                         .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,uVar1);
    this_02 = BasicBlock::GetMergeInst(this_01);
    uVar1 = (this_02->has_result_id_ & 1) + 1;
    if (this_02->has_type_id_ == false) {
      uVar1 = (uint)this_02->has_result_id_;
    }
    uVar1 = Instruction::GetSingleWordOperand(this_02,uVar1);
  }
  return uVar1;
}

Assistant:

uint32_t StructuredCFGAnalysis::MergeBlock(uint32_t bb_id) {
  uint32_t header_id = ContainingConstruct(bb_id);
  if (header_id == 0) {
    return 0;
  }

  BasicBlock* header = context_->cfg()->block(header_id);
  Instruction* merge_inst = header->GetMergeInst();
  return merge_inst->GetSingleWordInOperand(kMergeNodeIndex);
}